

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int deranged_sample(int a,int *seed)

{
  int iVar1;
  double cdf_00;
  int x;
  double cdf;
  int *seed_local;
  int a_local;
  
  cdf_00 = r8_uniform_01(seed);
  iVar1 = deranged_cdf_inv(cdf_00,a);
  return iVar1;
}

Assistant:

int deranged_sample ( int a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_SAMPLE samples the Deranged PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int DERANGED_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int x;

  cdf = r8_uniform_01 ( seed );

  x = deranged_cdf_inv ( cdf, a );

  return x;
}